

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O1

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>::TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint> *this,TPZCompMesh *mesh,
          TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  long lVar1;
  
  *(undefined ***)&(this->super_TPZMultiphysicsElement).super_TPZCompEl = &PTR__TPZSavable_01968f08;
  TPZMultiphysicsElement::TPZMultiphysicsElement
            (&this->super_TPZMultiphysicsElement,&PTR_PTR_01966f18);
  *(undefined ***)&(this->super_TPZMultiphysicsElement).super_TPZCompEl =
       &PTR__TPZMultiphysicsCompEl_01966c08;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore = (TPZCompElSide *)0x0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements = 0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fNAlloc = 0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0196bdf8;
  lVar1 = 0xa0;
  do {
    *(undefined8 *)
     ((long)(this->super_TPZMultiphysicsElement).fActiveApproxSpace.fExtAlloc + lVar1 + -0x68) = 0;
    *(undefined4 *)
     ((long)(this->super_TPZMultiphysicsElement).fActiveApproxSpace.fExtAlloc + lVar1 + -0x60) =
         0xffffffff;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xf0);
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore = (this->fElementVec).fExtAlloc;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements = 0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fNAlloc = 0;
  (this->fConnectIndexes)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->fConnectIndexes).fStore = (long *)0x0;
  (this->fConnectIndexes).fNElements = 0;
  (this->fConnectIndexes).fNAlloc = 0;
  (this->fIntRule).super_TPZIntPoints._vptr_TPZIntPoints = (_func_int **)&PTR__TPZIntPoints_018a04d0
  ;
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
             ,0x45);
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::TPZMultiphysicsCompEl(TPZCompMesh &mesh,
                                                        const TPZMultiphysicsCompEl<TGeometry> &copy,
                                                        std::map<int64_t,int64_t> & gl2lcConMap,
                                                        std::map<int64_t,int64_t> & gl2lcElMap) : TPZRegisterClassId(&TPZMultiphysicsCompEl::ClassId){
    
    DebugStop(); // if this is called, withmem should not work
}